

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O3

void __thiscall RtApi::clearStreamInfo(RtApi *this)

{
  ConvertInfo *pCVar1;
  RtAudioFormat *pRVar2;
  pointer piVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  
  (this->stream_).mode = UNINITIALIZED;
  (this->stream_).state = STREAM_CLOSED;
  (this->stream_).sampleRate = 0;
  (this->stream_).bufferSize = 0;
  (this->stream_).nBuffers = 0;
  (this->stream_).userFormat = 0;
  (this->stream_).userInterleaved = true;
  (this->stream_).streamTime = 0.0;
  (this->stream_).apiHandle = (void *)0x0;
  (this->stream_).deviceBuffer = (char *)0x0;
  (this->stream_).callbackInfo.isRunning = false;
  (this->stream_).callbackInfo.deviceDisconnected = false;
  (this->stream_).callbackInfo.callback = (void *)0x0;
  (this->stream_).callbackInfo.userData = (void *)0x0;
  lVar6 = 0;
  bVar4 = true;
  do {
    bVar5 = bVar4;
    (this->stream_).deviceId[lVar6] = 0x2b67;
    (this->stream_).doConvertBuffer[lVar6] = false;
    (this->stream_).deviceInterleaved[lVar6] = true;
    (this->stream_).doByteSwap[lVar6] = false;
    (this->stream_).nUserChannels[lVar6] = 0;
    (this->stream_).nDeviceChannels[lVar6] = 0;
    (this->stream_).channelOffset[lVar6] = 0;
    (this->stream_).deviceFormat[lVar6] = 0;
    (this->stream_).latency[lVar6] = 0;
    (this->stream_).userBuffer[lVar6] = (char *)0x0;
    pCVar1 = (this->stream_).convertInfo + lVar6;
    pCVar1->channels = 0;
    pCVar1->inJump = 0;
    (this->stream_).convertInfo[lVar6].outJump = 0;
    pRVar2 = &(this->stream_).convertInfo[lVar6].inFormat;
    *pRVar2 = 0;
    pRVar2[1] = 0;
    piVar3 = (this->stream_).convertInfo[lVar6].inOffset.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if ((this->stream_).convertInfo[lVar6].inOffset.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish != piVar3) {
      (this->stream_).convertInfo[lVar6].inOffset.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish = piVar3;
    }
    piVar3 = (this->stream_).convertInfo[lVar6].outOffset.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if ((this->stream_).convertInfo[lVar6].outOffset.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish != piVar3) {
      (this->stream_).convertInfo[lVar6].outOffset.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish = piVar3;
    }
    lVar6 = 1;
    bVar4 = false;
  } while (bVar5);
  return;
}

Assistant:

void RtApi :: clearStreamInfo()
{
  stream_.mode = UNINITIALIZED;
  stream_.state = STREAM_CLOSED;
  stream_.sampleRate = 0;
  stream_.bufferSize = 0;
  stream_.nBuffers = 0;
  stream_.userFormat = 0;
  stream_.userInterleaved = true;
  stream_.streamTime = 0.0;
  stream_.apiHandle = 0;
  stream_.deviceBuffer = 0;
  stream_.callbackInfo.callback = 0;
  stream_.callbackInfo.userData = 0;
  stream_.callbackInfo.isRunning = false;
  stream_.callbackInfo.deviceDisconnected = false;
  for ( int i=0; i<2; i++ ) {
    stream_.deviceId[i] = 11111;
    stream_.doConvertBuffer[i] = false;
    stream_.deviceInterleaved[i] = true;
    stream_.doByteSwap[i] = false;
    stream_.nUserChannels[i] = 0;
    stream_.nDeviceChannels[i] = 0;
    stream_.channelOffset[i] = 0;
    stream_.deviceFormat[i] = 0;
    stream_.latency[i] = 0;
    stream_.userBuffer[i] = 0;
    stream_.convertInfo[i].channels = 0;
    stream_.convertInfo[i].inJump = 0;
    stream_.convertInfo[i].outJump = 0;
    stream_.convertInfo[i].inFormat = 0;
    stream_.convertInfo[i].outFormat = 0;
    stream_.convertInfo[i].inOffset.clear();
    stream_.convertInfo[i].outOffset.clear();
  }
}